

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O3

void __thiscall
cmStateDirectory::AppendProperty
          (cmStateDirectory *this,string *prop,string *value,bool asString,cmListFileBacktrace *lfbt
          )

{
  pointer pcVar1;
  int iVar2;
  PointerType pBVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  iVar2 = std::__cxx11::string::compare((char *)prop);
  if (iVar2 == 0) {
    pcVar1 = (value->_M_dataplus)._M_p;
    local_48 = &local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + value->_M_string_length);
    local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (lfbt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (lfbt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
              .
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
              .
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    paVar5 = &local_f8.Value.field_2;
    if (local_48 == &local_38) {
      local_f8.Value.field_2._8_8_ = local_38._8_8_;
      local_f8.Value._M_dataplus._M_p = (pointer)paVar5;
    }
    else {
      local_f8.Value._M_dataplus._M_p = (pointer)local_48;
    }
    local_f8.Value.field_2._M_allocated_capacity._1_7_ = local_38._M_allocated_capacity._1_7_;
    local_f8.Value.field_2._M_local_buf[0] = local_38._M_local_buf[0];
    local_f8.Value._M_string_length = local_40;
    local_40 = 0;
    local_38._M_local_buf[0] = '\0';
    local_48 = &local_38;
    AppendIncludeDirectoriesEntry(this,&local_f8);
    if (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Value._M_dataplus._M_p != paVar5) {
      operator_delete(local_f8.Value._M_dataplus._M_p,
                      local_f8.Value.field_2._M_allocated_capacity + 1);
    }
    if (local_48 == &local_38) {
      return;
    }
    lVar4 = CONCAT71(local_38._M_allocated_capacity._1_7_,local_38._M_local_buf[0]);
    paVar5 = local_48;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)prop);
    if (iVar2 == 0) {
      pcVar1 = (value->_M_dataplus)._M_p;
      local_68 = &local_58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar1,pcVar1 + value->_M_string_length);
      local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (lfbt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (lfbt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      paVar5 = &local_f8.Value.field_2;
      if (local_68 == &local_58) {
        local_f8.Value.field_2._8_8_ = local_58._8_8_;
        local_f8.Value._M_dataplus._M_p = (pointer)paVar5;
      }
      else {
        local_f8.Value._M_dataplus._M_p = (pointer)local_68;
      }
      local_f8.Value.field_2._M_allocated_capacity._1_7_ = local_58._M_allocated_capacity._1_7_;
      local_f8.Value.field_2._M_local_buf[0] = local_58._M_local_buf[0];
      local_f8.Value._M_string_length = local_60;
      local_60 = 0;
      local_58._M_local_buf[0] = '\0';
      local_68 = &local_58;
      AppendCompileOptionsEntry(this,&local_f8);
      if (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.Value._M_dataplus._M_p != paVar5) {
        operator_delete(local_f8.Value._M_dataplus._M_p,
                        local_f8.Value.field_2._M_allocated_capacity + 1);
      }
      if (local_68 == &local_58) {
        return;
      }
      lVar4 = CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]);
      paVar5 = local_68;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)prop);
      if (iVar2 == 0) {
        pcVar1 = (value->_M_dataplus)._M_p;
        local_88 = &local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,pcVar1,pcVar1 + value->_M_string_length);
        local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (lfbt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (lfbt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        paVar5 = &local_f8.Value.field_2;
        if (local_88 == &local_78) {
          local_f8.Value.field_2._8_8_ = local_78._8_8_;
          local_f8.Value._M_dataplus._M_p = (pointer)paVar5;
        }
        else {
          local_f8.Value._M_dataplus._M_p = (pointer)local_88;
        }
        local_f8.Value.field_2._M_allocated_capacity._1_7_ = local_78._M_allocated_capacity._1_7_;
        local_f8.Value.field_2._M_local_buf[0] = local_78._M_local_buf[0];
        local_f8.Value._M_string_length = local_80;
        local_80 = 0;
        local_78._M_local_buf[0] = '\0';
        local_88 = &local_78;
        AppendCompileDefinitionsEntry(this,&local_f8);
        if (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                     TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.Value._M_dataplus._M_p != paVar5) {
          operator_delete(local_f8.Value._M_dataplus._M_p,
                          local_f8.Value.field_2._M_allocated_capacity + 1);
        }
        if (local_88 == &local_78) {
          return;
        }
        lVar4 = CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]);
        paVar5 = local_88;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)prop);
        if (iVar2 == 0) {
          pcVar1 = (value->_M_dataplus)._M_p;
          local_a8 = &local_98;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,pcVar1,pcVar1 + value->_M_string_length);
          local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (lfbt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi =
               (lfbt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          if (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
              .
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          paVar5 = &local_f8.Value.field_2;
          if (local_a8 == &local_98) {
            local_f8.Value.field_2._8_8_ = local_98._8_8_;
            local_f8.Value._M_dataplus._M_p = (pointer)paVar5;
          }
          else {
            local_f8.Value._M_dataplus._M_p = (pointer)local_a8;
          }
          local_f8.Value.field_2._M_allocated_capacity._1_7_ = local_98._M_allocated_capacity._1_7_;
          local_f8.Value.field_2._M_local_buf[0] = local_98._M_local_buf[0];
          local_f8.Value._M_string_length = local_a0;
          local_a0 = 0;
          local_98._M_local_buf[0] = '\0';
          local_a8 = &local_98;
          AppendLinkOptionsEntry(this,&local_f8);
          if (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
              .
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                       .TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8.Value._M_dataplus._M_p != paVar5) {
            operator_delete(local_f8.Value._M_dataplus._M_p,
                            local_f8.Value.field_2._M_allocated_capacity + 1);
          }
          if (local_a8 == &local_98) {
            return;
          }
          lVar4 = CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]);
          paVar5 = local_a8;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)prop);
          if (iVar2 != 0) {
            pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                     operator->(&this->DirectoryState);
            cmPropertyMap::AppendProperty(&pBVar3->Properties,prop,value,asString);
            return;
          }
          pcVar1 = (value->_M_dataplus)._M_p;
          local_c8 = &local_b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,pcVar1,pcVar1 + value->_M_string_length);
          local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (lfbt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi =
               (lfbt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          if (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
              .
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          paVar5 = &local_f8.Value.field_2;
          if (local_c8 == &local_b8) {
            local_f8.Value.field_2._8_8_ = local_b8._8_8_;
            local_f8.Value._M_dataplus._M_p = (pointer)paVar5;
          }
          else {
            local_f8.Value._M_dataplus._M_p = (pointer)local_c8;
          }
          local_f8.Value.field_2._M_allocated_capacity._1_7_ = local_b8._M_allocated_capacity._1_7_;
          local_f8.Value.field_2._M_local_buf[0] = local_b8._M_local_buf[0];
          local_f8.Value._M_string_length = local_c0;
          local_c0 = 0;
          local_b8._M_local_buf[0] = '\0';
          local_c8 = &local_b8;
          AppendLinkDirectoriesEntry(this,&local_f8);
          if (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
              .
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                       .TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8.Value._M_dataplus._M_p != paVar5) {
            operator_delete(local_f8.Value._M_dataplus._M_p,
                            local_f8.Value.field_2._M_allocated_capacity + 1);
          }
          if (local_c8 == &local_b8) {
            return;
          }
          lVar4 = CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]);
          paVar5 = local_c8;
        }
      }
    }
  }
  operator_delete(paVar5,lVar4 + 1);
  return;
}

Assistant:

void cmStateDirectory::AppendProperty(const std::string& prop,
                                      const std::string& value, bool asString,
                                      cmListFileBacktrace const& lfbt)
{
  if (prop == "INCLUDE_DIRECTORIES") {
    this->AppendIncludeDirectoriesEntry(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "COMPILE_OPTIONS") {
    this->AppendCompileOptionsEntry(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "COMPILE_DEFINITIONS") {
    this->AppendCompileDefinitionsEntry(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "LINK_OPTIONS") {
    this->AppendLinkOptionsEntry(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "LINK_DIRECTORIES") {
    this->AppendLinkDirectoriesEntry(BT<std::string>(value, lfbt));
    return;
  }

  this->DirectoryState->Properties.AppendProperty(prop, value, asString);
}